

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O0

void __thiscall discordpp::Message::~Message(Message *this)

{
  Message *this_local;
  
  omittable_field<discordpp::RoleSubscriptionData>::~omittable_field(&this->role_subscription_data);
  omittable_field<int>::~omittable_field(&this->position);
  omittable_field<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>::
  ~omittable_field(&this->stickers);
  omittable_field<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>_>::
  ~omittable_field(&this->sticker_items);
  omittable_field<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>_>::
  ~omittable_field(&this->components);
  omittable_field<discordpp::Channel>::~omittable_field(&this->thread);
  omittable_field<discordpp::MessageInteraction>::~omittable_field(&this->interaction);
  nullable_omittable_field<discordpp::Message>::~nullable_omittable_field(&this->referenced_message)
  ;
  omittable_field<int>::~omittable_field(&this->flags);
  omittable_field<discordpp::MessageReference>::~omittable_field(&this->message_reference);
  omittable_field<discordpp::Snowflake>::~omittable_field(&this->application_id);
  omittable_field<discordpp::Application>::~omittable_field(&this->application);
  omittable_field<discordpp::MessageActivity>::~omittable_field(&this->activity);
  field<int>::~field(&this->type);
  omittable_field<discordpp::Snowflake>::~omittable_field(&this->webhook_id);
  field<bool>::~field(&this->pinned);
  omittable_field<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~omittable_field(&this->nonce);
  omittable_field<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>_>::
  ~omittable_field(&this->reactions);
  field<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_>::~field(&this->embeds);
  field<std::vector<discordpp::Attachment,_std::allocator<discordpp::Attachment>_>_>::~field
            (&this->attachments);
  omittable_field<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>
  ::~omittable_field(&this->mention_channels);
  field<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>::~field
            (&this->mention_roles);
  field<std::vector<discordpp::User,_std::allocator<discordpp::User>_>_>::~field(&this->mentions);
  field<bool>::~field(&this->mention_everyone);
  field<bool>::~field(&this->tts);
  nullable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~nullable_field(&this->edited_timestamp);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~field
            (&this->timestamp);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~field
            (&this->content);
  field<discordpp::User>::~field(&this->author);
  field<discordpp::Snowflake>::~field(&this->channel_id);
  field<discordpp::Snowflake>::~field(&this->id);
  return;
}

Assistant:

Message(
        field<Snowflake> id = uninitialized,
        field<Snowflake> channel_id = uninitialized,
        field<User> author = uninitialized,
        field<std::string> content = uninitialized,
        field<Timestamp> timestamp = uninitialized,
        nullable_field<Timestamp> edited_timestamp = uninitialized,
        field<bool> tts = uninitialized,
        field<bool> mention_everyone = uninitialized,
        field<std::vector<User> > mentions = uninitialized,
        field<std::vector<Snowflake> > mention_roles = uninitialized,
        omittable_field<std::vector<ChannelMention> > mention_channels = omitted,
        field<std::vector<Attachment> > attachments = uninitialized,
        field<std::vector<Embed> > embeds = uninitialized,
        omittable_field<std::vector<Reaction> > reactions = omitted,
        omittable_field<std::variant<int, std::string> > nonce = omitted,
        field<bool> pinned = uninitialized,
        omittable_field<Snowflake> webhook_id = omitted,
        field<int> type = uninitialized,
        omittable_field<MessageActivity> activity = omitted,
        omittable_field<Application> application = omitted,
        omittable_field<Snowflake> application_id = omitted,
        omittable_field<MessageReference> message_reference = omitted,
        omittable_field<int> flags = omitted,
        nullable_omittable_field<Message> referenced_message = omitted,
        omittable_field<MessageInteraction> interaction = omitted,
        omittable_field<Channel> thread = omitted,
        omittable_field<std::vector<Component> > components = omitted,
        omittable_field<std::vector<StickerItem> > sticker_items = omitted,
        omittable_field<std::vector<Sticker> > stickers = omitted,
        omittable_field<int> position = omitted,
        omittable_field<RoleSubscriptionData> role_subscription_data = omitted
    ):
        id(id),
        channel_id(channel_id),
        author(author),
        content(content),
        timestamp(timestamp),
        edited_timestamp(edited_timestamp),
        tts(tts),
        mention_everyone(mention_everyone),
        mentions(mentions),
        mention_roles(mention_roles),
        mention_channels(mention_channels),
        attachments(attachments),
        embeds(embeds),
        reactions(reactions),
        nonce(nonce),
        pinned(pinned),
        webhook_id(webhook_id),
        type(type),
        activity(activity),
        application(application),
        application_id(application_id),
        message_reference(message_reference),
        flags(flags),
        referenced_message(referenced_message),
        interaction(interaction),
        thread(thread),
        components(components),
        sticker_items(sticker_items),
        stickers(stickers),
        position(position),
        role_subscription_data(role_subscription_data)
    {}